

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O1

void sect_EndUnion(void)

{
  UnionStackEntry *pUVar1;
  uint32_t *puVar2;
  UnionStackEntry *__ptr;
  uint uVar3;
  
  __ptr = unionStack;
  if (unionStack != (UnionStackEntry *)0x0) {
    puVar2 = &unionStack->start;
    uVar3 = curOffset - *puVar2;
    if (unionStack->size < uVar3) {
      unionStack->size = uVar3;
    }
    curOffset = *puVar2 + __ptr->size;
    pUVar1 = __ptr->next;
    free(__ptr);
    unionStack = pUVar1;
    return;
  }
  error("Found ENDU outside of a UNION construct\n");
  return;
}

Assistant:

void sect_EndUnion(void)
{
	if (!unionStack) {
		error("Found ENDU outside of a UNION construct\n");
		return;
	}
	endUnionMember();
	curOffset += unionStack->size;
	struct UnionStackEntry *next = unionStack->next;

	free(unionStack);
	unionStack = next;
}